

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall GameBoard::GameBoard(GameBoard *this,int size)

{
  int iVar1;
  int y;
  int iVar2;
  vector<int,_std::allocator<int>_> row;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->board_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->board_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->board_matrix).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size = size;
  for (iVar1 = 0; iVar1 < size; iVar1 = iVar1 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar2 = 0; iVar2 < size; iVar2 = iVar2 + 1) {
      local_4c = 0;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
      size = this->size;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->board_matrix,(value_type *)&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    size = this->size;
  }
  return;
}

Assistant:

GameBoard::GameBoard(int size) {
    this->size = size;
    for (int x = 0; x < this->size; x++) {
        vector<int> row;
        for (int y = 0; y < this->size; y++) {
            row.push_back(0);
        }
        this->board_matrix.push_back(row);
    }
}